

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt_gen.cpp
# Opt level: O2

void get_msurf_descriptor_haar_unroll_2_2_True(integral_image *iimage,interest_point *ipoint)

{
  long lVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int i;
  int row;
  int row_00;
  int col;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  int col_00;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  float *pfVar27;
  long lVar28;
  float *pfVar29;
  long lVar30;
  long lVar31;
  float *pfVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [64];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 in_ZMM8 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [64];
  
  auVar41._8_4_ = 0x3effffff;
  auVar41._0_8_ = 0x3effffff3effffff;
  auVar41._12_4_ = 0x3effffff;
  auVar40._8_4_ = 0x80000000;
  auVar40._0_8_ = 0x8000000080000000;
  auVar40._12_4_ = 0x80000000;
  fVar46 = ipoint->scale;
  auVar63 = ZEXT464((uint)fVar46);
  auVar42 = ZEXT416((uint)fVar46);
  auVar33 = vpternlogd_avx512vl(auVar41,auVar42,auVar40,0xf8);
  auVar33 = ZEXT416((uint)(fVar46 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  fVar45 = -0.08 / (fVar46 * fVar46);
  iVar20 = (int)auVar33._0_4_;
  auVar34._0_4_ = (int)auVar33._0_4_;
  auVar34._4_4_ = (int)auVar33._4_4_;
  auVar34._8_4_ = (int)auVar33._8_4_;
  auVar34._12_4_ = (int)auVar33._12_4_;
  auVar33 = vcvtdq2ps_avx(auVar34);
  auVar34 = vpternlogd_avx512vl(auVar41,ZEXT416((uint)ipoint->x),auVar40,0xf8);
  auVar34 = ZEXT416((uint)(ipoint->x + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35._0_8_ = (double)auVar34._0_4_;
  auVar35._8_8_ = auVar34._8_8_;
  auVar39._0_8_ = (double)fVar46;
  auVar39._8_8_ = 0;
  auVar34 = vfmadd231sd_fma(auVar35,auVar39,ZEXT816(0x3fe0000000000000));
  auVar38._0_4_ = (float)auVar34._0_8_;
  auVar38._4_12_ = auVar34._4_12_;
  auVar34 = vpternlogd_avx512vl(auVar41,ZEXT416((uint)ipoint->y),auVar40,0xf8);
  fVar3 = auVar38._0_4_ - auVar33._0_4_;
  auVar34 = ZEXT416((uint)(ipoint->y + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar36._0_8_ = (double)auVar34._0_4_;
  auVar36._8_8_ = auVar34._8_8_;
  auVar34 = vfmadd231sd_fma(auVar36,auVar39,ZEXT816(0x3fe0000000000000));
  auVar37._0_4_ = (float)auVar34._0_8_;
  auVar37._4_12_ = auVar34._4_12_;
  fVar62 = auVar37._0_4_ - auVar33._0_4_;
  auVar35 = ZEXT416((uint)fVar46);
  auVar33 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar35,auVar38);
  auVar34 = vpternlogd_avx512vl(auVar41,auVar33,auVar40,0xf8);
  auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  if (iVar20 < (int)auVar33._0_4_) {
    auVar43._8_4_ = 0x3effffff;
    auVar43._0_8_ = 0x3effffff3effffff;
    auVar43._12_4_ = 0x3effffff;
    auVar44._8_4_ = 0x80000000;
    auVar44._0_8_ = 0x8000000080000000;
    auVar44._12_4_ = 0x80000000;
    auVar33 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1400000),0),auVar35,auVar37);
    auVar34 = vpternlogd_avx512vl(auVar44,auVar33,auVar43,0xea);
    auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
    auVar33 = vroundss_avx(auVar33,auVar33,0xb);
    if (iVar20 < (int)auVar33._0_4_) {
      auVar33 = vfmadd231ss_fma(auVar38,auVar35,ZEXT416(0x41300000));
      auVar57._8_4_ = 0x80000000;
      auVar57._0_8_ = 0x8000000080000000;
      auVar57._12_4_ = 0x80000000;
      auVar34 = vpternlogd_avx512vl(auVar57,auVar33,auVar43,0xea);
      auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
      auVar33 = vroundss_avx(auVar33,auVar33,0xb);
      if ((int)auVar33._0_4_ + iVar20 <= iimage->width) {
        auVar33 = vfmadd231ss_fma(auVar37,auVar35,ZEXT416(0x41300000));
        auVar14._8_4_ = 0x80000000;
        auVar14._0_8_ = 0x8000000080000000;
        auVar14._12_4_ = 0x80000000;
        auVar34 = vpternlogd_avx512vl(auVar43,auVar33,auVar14,0xf8);
        auVar33 = ZEXT416((uint)(auVar33._0_4_ + auVar34._0_4_));
        auVar33 = vroundss_avx(auVar33,auVar33,0xb);
        if ((int)auVar33._0_4_ + iVar20 <= iimage->height) {
          lVar31 = 100;
          for (uVar17 = 0xfffffff4; (int)uVar17 < 0xc; uVar17 = uVar17 + 2) {
            auVar33._0_4_ = (float)(int)uVar17;
            auVar33._4_12_ = in_ZMM8._4_12_;
            auVar33 = vfmadd213ss_fma(auVar33,auVar63._0_16_,ZEXT416((uint)(fVar62 + 0.5)));
            auVar49._0_4_ = (float)(int)(uVar17 | 1);
            auVar49._4_12_ = in_ZMM8._4_12_;
            auVar34 = vfmadd213ss_fma(auVar49,auVar63._0_16_,ZEXT416((uint)(fVar62 + 0.5)));
            lVar30 = lVar31;
            for (iVar16 = -0xc; iVar16 < 0xc; iVar16 = iVar16 + 2) {
              auVar50._0_4_ = (float)iVar16;
              auVar50._4_12_ = in_ZMM8._4_12_;
              auVar35 = vfmadd213ss_fma(auVar50,auVar42,ZEXT416((uint)(fVar3 + 0.5)));
              auVar51._0_4_ = (float)(iVar16 + 1);
              auVar51._4_12_ = in_ZMM8._4_12_;
              auVar36 = vfmadd213ss_fma(auVar51,auVar42,ZEXT416((uint)(fVar3 + 0.5)));
              haarXY_unconditional
                        (iimage,(int)auVar33._0_4_,(int)auVar35._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30 + -100),
                         (float *)((long)haarResponseY + lVar30 + -100));
              haarXY_unconditional
                        (iimage,(int)auVar34._0_4_,(int)auVar35._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30 + -4),
                         (float *)((long)haarResponseY + lVar30 + -4));
              haarXY_unconditional
                        (iimage,(int)auVar33._0_4_,(int)auVar36._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30 + -0x60),
                         (float *)((long)haarResponseY + lVar30 + -0x60));
              haarXY_unconditional
                        (iimage,(int)auVar34._0_4_,(int)auVar36._0_4_,iVar20,
                         (float *)((long)haarResponseX + lVar30),
                         (float *)((long)haarResponseY + lVar30));
              lVar30 = lVar30 + 8;
            }
            auVar63 = ZEXT1664(auVar42);
            lVar31 = lVar31 + 0xc0;
          }
          goto LAB_00168ca6;
        }
      }
    }
  }
  lVar31 = 100;
  for (uVar17 = 0xfffffff4; (int)uVar17 < 0xc; uVar17 = uVar17 + 2) {
    auVar47._0_4_ = (float)(int)uVar17;
    auVar47._4_12_ = in_ZMM8._4_12_;
    auVar33 = vfmadd213ss_fma(auVar47,auVar63._0_16_,ZEXT416((uint)fVar62));
    auVar53._0_4_ = (float)(int)(uVar17 | 1);
    auVar53._4_12_ = in_ZMM8._4_12_;
    fVar46 = auVar33._0_4_;
    auVar33 = vfmadd213ss_fma(auVar53,auVar63._0_16_,ZEXT416((uint)fVar62));
    fVar52 = auVar33._0_4_;
    row = (int)((double)((ulong)(0.0 <= fVar46) * 0x3fe0000000000000 +
                        (ulong)(0.0 > fVar46) * -0x4020000000000000) + (double)fVar46);
    row_00 = (int)((double)((ulong)(0.0 <= fVar52) * 0x3fe0000000000000 +
                           (ulong)(0.0 > fVar52) * -0x4020000000000000) + (double)fVar52);
    lVar30 = lVar31;
    for (iVar16 = -0xc; iVar16 < 0xc; iVar16 = iVar16 + 2) {
      auVar48._0_4_ = (float)iVar16;
      auVar48._4_12_ = in_ZMM8._4_12_;
      auVar33 = vfmadd213ss_fma(auVar48,auVar42,ZEXT416((uint)fVar3));
      auVar54._0_4_ = (float)(iVar16 + 1);
      auVar54._4_12_ = in_ZMM8._4_12_;
      auVar34 = vfmadd213ss_fma(auVar54,auVar42,ZEXT416((uint)fVar3));
      fVar46 = auVar33._0_4_;
      fVar52 = auVar34._0_4_;
      col_00 = (int)((double)((ulong)(0.0 <= fVar46) * 0x3fe0000000000000 +
                             (ulong)(0.0 > fVar46) * -0x4020000000000000) + (double)fVar46);
      col = (int)((double)((ulong)(0.0 <= fVar52) * 0x3fe0000000000000 +
                          (ulong)(0.0 > fVar52) * -0x4020000000000000) + (double)fVar52);
      haarXY_precheck_boundaries
                (iimage,row,col_00,iVar20,(float *)((long)haarResponseX + lVar30 + -100),
                 (float *)((long)haarResponseY + lVar30 + -100));
      haarXY_precheck_boundaries
                (iimage,row_00,col_00,iVar20,(float *)((long)haarResponseX + lVar30 + -4),
                 (float *)((long)haarResponseY + lVar30 + -4));
      haarXY_precheck_boundaries
                (iimage,row,col,iVar20,(float *)((long)haarResponseX + lVar30 + -0x60),
                 (float *)((long)haarResponseY + lVar30 + -0x60));
      haarXY_precheck_boundaries
                (iimage,row_00,col,iVar20,(float *)((long)haarResponseX + lVar30),
                 (float *)((long)haarResponseY + lVar30));
      lVar30 = lVar30 + 8;
    }
    auVar63 = ZEXT1664(auVar42);
    lVar31 = lVar31 + 0xc0;
  }
LAB_00168ca6:
  fVar62 = auVar63._0_4_;
  auVar61._8_4_ = 0x3effffff;
  auVar61._0_8_ = 0x3effffff3effffff;
  auVar61._12_4_ = 0x3effffff;
  auVar60._8_4_ = 0x80000000;
  auVar60._0_8_ = 0x8000000080000000;
  auVar60._12_4_ = 0x80000000;
  auVar33 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 0.5)),auVar60,0xf8);
  auVar33 = ZEXT416((uint)(fVar62 * 0.5 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  auVar34 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 1.5)),auVar60,0xf8);
  auVar34 = ZEXT416((uint)(fVar62 * 1.5 + auVar34._0_4_));
  auVar34 = vroundss_avx(auVar34,auVar34,0xb);
  auVar35 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 2.5)),auVar60,0xf8);
  auVar35 = ZEXT416((uint)(fVar62 * 2.5 + auVar35._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  auVar36 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 3.5)),auVar60,0xf8);
  auVar36 = ZEXT416((uint)(fVar62 * 3.5 + auVar36._0_4_));
  auVar36 = vroundss_avx(auVar36,auVar36,0xb);
  auVar37 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 4.5)),auVar60,0xf8);
  auVar37 = ZEXT416((uint)(fVar62 * 4.5 + auVar37._0_4_));
  auVar37 = vroundss_avx(auVar37,auVar37,0xb);
  auVar38 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 5.5)),auVar60,0xf8);
  auVar38 = ZEXT416((uint)(fVar62 * 5.5 + auVar38._0_4_));
  auVar38 = vroundss_avx(auVar38,auVar38,0xb);
  auVar39 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 6.5)),auVar60,0xf8);
  auVar39 = ZEXT416((uint)(fVar62 * 6.5 + auVar39._0_4_));
  auVar39 = vroundss_avx(auVar39,auVar39,0xb);
  auVar40 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 7.5)),auVar60,0xf8);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ + fVar62 * 7.5));
  auVar40 = vroundss_avx(auVar40,auVar40,0xb);
  auVar41 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 8.5)),auVar60,0xf8);
  auVar41 = ZEXT416((uint)(fVar62 * 8.5 + auVar41._0_4_));
  auVar41 = vroundss_avx(auVar41,auVar41,0xb);
  auVar42 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 9.5)),auVar60,0xf8);
  auVar42 = ZEXT416((uint)(fVar62 * 9.5 + auVar42._0_4_));
  auVar42 = vroundss_avx(auVar42,auVar42,0xb);
  auVar43 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 10.5)),auVar60,0xf8);
  auVar43 = ZEXT416((uint)(fVar62 * 10.5 + auVar43._0_4_));
  auVar43 = vroundss_avx(auVar43,auVar43,0xb);
  auVar44 = vpternlogd_avx512vl(auVar61,ZEXT416((uint)(fVar62 * 11.5)),auVar60,0xf8);
  fVar55 = auVar35._0_4_;
  fVar46 = fVar55 + auVar34._0_4_;
  fVar3 = fVar55 + auVar33._0_4_;
  auVar35 = ZEXT416((uint)(fVar62 * 11.5 + auVar44._0_4_));
  auVar35 = vroundss_avx(auVar35,auVar35,0xb);
  fVar62 = fVar55 - auVar33._0_4_;
  fVar52 = fVar55 - auVar34._0_4_;
  fVar4 = fVar55 - auVar36._0_4_;
  fVar5 = fVar55 - auVar37._0_4_;
  fVar6 = fVar55 - auVar38._0_4_;
  fVar55 = fVar55 - auVar39._0_4_;
  fVar59 = auVar40._0_4_;
  fVar7 = fVar59 - auVar36._0_4_;
  fVar8 = fVar59 - auVar37._0_4_;
  fVar9 = fVar59 - auVar38._0_4_;
  fVar10 = fVar59 - auVar39._0_4_;
  fVar11 = fVar59 - auVar41._0_4_;
  fVar12 = fVar59 - auVar42._0_4_;
  fVar13 = fVar59 - auVar43._0_4_;
  fVar59 = fVar59 - auVar35._0_4_;
  gauss_s1_c0[0] = expf(fVar46 * fVar46 * fVar45);
  gauss_s1_c0[1] = expf(fVar3 * fVar3 * fVar45);
  gauss_s1_c0[2] = expf(fVar62 * fVar62 * fVar45);
  gauss_s1_c0[3] = expf(fVar52 * fVar52 * fVar45);
  gauss_s1_c0[4] = 1.0;
  gauss_s1_c0[5] = expf(fVar4 * fVar4 * fVar45);
  gauss_s1_c0[6] = expf(fVar5 * fVar5 * fVar45);
  gauss_s1_c0[7] = expf(fVar6 * fVar6 * fVar45);
  gauss_s1_c0[8] = expf(fVar55 * fVar55 * fVar45);
  gauss_s1_c1[0] = expf(fVar7 * fVar7 * fVar45);
  gauss_s1_c1[1] = expf(fVar8 * fVar8 * fVar45);
  gauss_s1_c1[2] = expf(fVar9 * fVar9 * fVar45);
  gauss_s1_c1[3] = expf(fVar10 * fVar10 * fVar45);
  gauss_s1_c1[4] = 1.0;
  gauss_s1_c1[5] = expf(fVar11 * fVar11 * fVar45);
  gauss_s1_c1[6] = expf(fVar12 * fVar12 * fVar45);
  gauss_s1_c1[7] = expf(fVar13 * fVar13 * fVar45);
  gauss_s1_c1[8] = expf(fVar59 * fVar59 * fVar45);
  auVar63 = ZEXT1264(ZEXT812(0));
  lVar31 = 0;
  auVar42._8_4_ = 0x7fffffff;
  auVar42._0_8_ = 0x7fffffff7fffffff;
  auVar42._12_4_ = 0x7fffffff;
  iVar20 = 0;
  lVar30 = 0;
  uVar19 = 0xfffffffffffffff8;
  while (uVar17 = (uint)uVar19, (int)uVar17 < 8) {
    pfVar29 = gauss_s1_c1;
    if (uVar17 != 7) {
      pfVar29 = gauss_s1_c0;
    }
    lVar28 = (long)iVar20;
    lVar30 = (long)(int)lVar30;
    iVar20 = iVar20 + 4;
    if (uVar17 == 0xfffffff8) {
      pfVar29 = gauss_s1_c1;
    }
    uVar21 = 0;
    uVar26 = 0xfffffffffffffff8;
    lVar22 = lVar31;
    while (lVar28 != iVar20) {
      pfVar32 = gauss_s1_c1;
      iVar16 = (int)uVar26;
      if (iVar16 != 7) {
        pfVar32 = gauss_s1_c0;
      }
      auVar56 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar26 = (ulong)((uint)(uVar26 >> 0x1c) & 8);
      if (iVar16 == -8) {
        pfVar32 = gauss_s1_c1;
      }
      lVar23 = (long)haarResponseX + lVar22;
      lVar24 = (long)haarResponseY + lVar22;
      for (uVar18 = uVar21; uVar18 < iVar16 * 0x18 + 0x198; uVar18 = uVar18 + 0x18) {
        lVar25 = 0;
        pfVar27 = (float *)((long)pfVar29 + (ulong)(((uint)(uVar19 >> 0x1f) & 1) << 5));
        while (lVar25 != 9) {
          fVar46 = *pfVar27;
          pfVar27 = pfVar27 + (ulong)(~uVar17 >> 0x1f) * 2 + -1;
          lVar1 = lVar25 * 4;
          lVar2 = lVar25 * 4;
          lVar25 = lVar25 + 1;
          auVar35 = ZEXT416((uint)(pfVar32[uVar26] * fVar46 * *(float *)(lVar23 + lVar2)));
          auVar33 = vandps_avx(auVar35,auVar42);
          auVar36 = ZEXT416((uint)(pfVar32[uVar26] * fVar46 * *(float *)(lVar24 + lVar1)));
          auVar34 = vandps_avx(auVar36,auVar42);
          auVar35 = vinsertps_avx(auVar36,auVar35,0x10);
          auVar34 = vmovlhps_avx(auVar35,auVar34);
          auVar33 = vinsertps_avx(auVar34,auVar33,0x30);
          auVar56 = ZEXT1664(CONCAT412(auVar56._12_4_ + auVar33._12_4_,
                                       CONCAT48(auVar56._8_4_ + auVar33._8_4_,
                                                CONCAT44(auVar56._4_4_ + auVar33._4_4_,
                                                         auVar56._0_4_ + auVar33._0_4_))));
        }
        uVar26 = uVar26 + (ulong)(-1 < iVar16) * 2 + -1;
        lVar23 = lVar23 + 0x60;
        lVar24 = lVar24 + 0x60;
      }
      uVar26 = (ulong)(iVar16 + 5);
      uVar21 = uVar21 + 0x78;
      lVar22 = lVar22 + 0x1e0;
      fVar46 = gauss_s2_arr[lVar28];
      auVar15._4_4_ = fVar46;
      auVar15._0_4_ = fVar46;
      auVar15._8_4_ = fVar46;
      auVar15._12_4_ = fVar46;
      auVar36 = vmulps_avx512vl(auVar56._0_16_,auVar15);
      lVar28 = lVar28 + 1;
      auVar58._0_4_ = auVar36._0_4_ * auVar36._0_4_;
      auVar58._4_4_ = auVar36._4_4_ * auVar36._4_4_;
      auVar58._8_4_ = auVar36._8_4_ * auVar36._8_4_;
      auVar58._12_4_ = auVar36._12_4_ * auVar36._12_4_;
      auVar34 = vshufpd_avx(auVar36,auVar36,1);
      *(undefined1 (*) [16])(ipoint->descriptor + lVar30) = auVar36;
      lVar30 = lVar30 + 4;
      auVar33 = vmovshdup_avx(auVar58);
      auVar35 = vfmadd231ss_fma(auVar33,auVar36,auVar36);
      auVar33 = vshufps_avx(auVar36,auVar36,0xff);
      auVar34 = vfmadd213ss_fma(auVar34,auVar34,auVar35);
      auVar33 = vfmadd213ss_fma(auVar33,auVar33,auVar34);
      auVar63 = ZEXT464((uint)(auVar63._0_4_ + auVar33._0_4_));
    }
    lVar31 = lVar31 + 0x14;
    uVar19 = (ulong)(uVar17 + 5);
  }
  if (auVar63._0_4_ < 0.0) {
    fVar46 = sqrtf(auVar63._0_4_);
  }
  else {
    auVar33 = vsqrtss_avx(auVar63._0_16_,auVar63._0_16_);
    fVar46 = auVar33._0_4_;
  }
  for (lVar31 = 0; lVar31 != 0x40; lVar31 = lVar31 + 1) {
    ipoint->descriptor[lVar31] = (1.0 / fVar46) * ipoint->descriptor[lVar31];
  }
  return;
}

Assistant:

void get_msurf_descriptor_haar_unroll_2_2_True(struct integral_image* iimage, struct interest_point* ipoint) {

    float scale = ipoint->scale;
    int int_scale = (int) roundf(scale);
    float scale_squared = scale*scale;
    float g1_factor = -0.08f / (scale_squared); 

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    float ipoint_x_sub_int_scale = ipoint_x-int_scale;
    float ipoint_y_sub_int_scale = ipoint_y-int_scale;

    float ipoint_x_sub_int_scale_add_05 = ipoint_x-int_scale + 0.5;
    float ipoint_y_sub_int_scale_add_05 = ipoint_y-int_scale + 0.5;
    
    int width = iimage->width;
    int height = iimage->height;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    // check if we ever hit a boundary
    if (((int) roundf(ipoint_x - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_y - 12*scale)) - int_scale <= 0 
        || ((int) roundf(ipoint_x + 11*scale)) + int_scale > width 
        || ((int) roundf(ipoint_y + 11*scale)) + int_scale > height) 
    {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            float ipoint_y_sub_int_scale_add_l0_mul_scale = ipoint_y_sub_int_scale + l0 * scale;
            float ipoint_y_sub_int_scale_add_l1_mul_scale = ipoint_y_sub_int_scale + l1 * scale;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_l0_mul_scale + (ipoint_y_sub_int_scale_add_l0_mul_scale>=0 ? 0.5 : -0.5));
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_l1_mul_scale + (ipoint_y_sub_int_scale_add_l1_mul_scale>=0 ? 0.5 : -0.5));

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                float ipoint_x_sub_int_scale_add_k0_mul_scale = ipoint_x_sub_int_scale + k0 * scale;
                float ipoint_x_sub_int_scale_add_k1_mul_scale = ipoint_x_sub_int_scale + k1 * scale;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_k0_mul_scale + (ipoint_x_sub_int_scale_add_k0_mul_scale>=0 ? 0.5 : -0.5));
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_k1_mul_scale + (ipoint_x_sub_int_scale_add_k1_mul_scale>=0 ? 0.5 : -0.5));

                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
            }
        }
    } else {
        for (int l=-12, l_count=0; l<12; l+=2, l_count+=2) {
            int l0 = l + 0;
            int l1 = l + 1;
            int l_count0 = l_count + 0;
            int l_count1 = l_count + 1;
            int sample_y_sub_int_scale0 = (int) (ipoint_y_sub_int_scale_add_05 + l0 * scale);
            int sample_y_sub_int_scale1 = (int) (ipoint_y_sub_int_scale_add_05 + l1 * scale);

            for (int k=-12, k_count=0; k<12; k+=2, k_count+=2) {
                int k0 = k + 0;
                int k1 = k + 1;
                int k_count0 = k_count + 0;
                int k_count1 = k_count + 1;
                int sample_x_sub_int_scale0 = (int) (ipoint_x_sub_int_scale_add_05 + k0 * scale);
                int sample_x_sub_int_scale1 = (int) (ipoint_x_sub_int_scale_add_05 + k1 * scale);

                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count0*24+k_count0], &haarResponseY[l_count0*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale0, int_scale, &haarResponseX[l_count1*24+k_count0], &haarResponseY[l_count1*24+k_count0]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale0, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count0*24+k_count1], &haarResponseY[l_count0*24+k_count1]);
                haarXY_unconditional(iimage, sample_y_sub_int_scale1, sample_x_sub_int_scale1, int_scale, &haarResponseX[l_count1*24+k_count1], &haarResponseY[l_count1*24+k_count1]);
            }
        }
    }

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    gauss_s1_c0[0] =  expf(g1_factor * (e_c0_m4 * e_c0_m4));
    gauss_s1_c0[1] =  expf(g1_factor * (e_c0_m3 * e_c0_m3));
    gauss_s1_c0[2] =  expf(g1_factor * (e_c0_m2 * e_c0_m2));
    gauss_s1_c0[3] =  expf(g1_factor * (e_c0_m1 * e_c0_m1));
    gauss_s1_c0[4] =  1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    gauss_s1_c0[5] =  expf(g1_factor * (e_c0_p1 * e_c0_p1));
    gauss_s1_c0[6] =  expf(g1_factor * (e_c0_p2 * e_c0_p2));
    gauss_s1_c0[7] =  expf(g1_factor * (e_c0_p3 * e_c0_p3));
    gauss_s1_c0[8] =  expf(g1_factor * (e_c0_p4 * e_c0_p4));

    gauss_s1_c1[0] =  expf(g1_factor * (e_c1_m4 * e_c1_m4));
    gauss_s1_c1[1] =  expf(g1_factor * (e_c1_m3 * e_c1_m3));
    gauss_s1_c1[2] =  expf(g1_factor * (e_c1_m2 * e_c1_m2));
    gauss_s1_c1[3] =  expf(g1_factor * (e_c1_m1 * e_c1_m1));
    gauss_s1_c1[4] =  1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    gauss_s1_c1[5] =  expf(g1_factor * (e_c1_p1 * e_c1_p1));
    gauss_s1_c1[6] =  expf(g1_factor * (e_c1_p2 * e_c1_p2));
    gauss_s1_c1[7] =  expf(g1_factor * (e_c1_p3 * e_c1_p3));
    gauss_s1_c1[8] =  expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        float *i_arr;
        if (i == -8 || i == 7) {
            i_arr = gauss_s1_c1;
        } else {
            i_arr = gauss_s1_c0;
        } 

        int gauss_index_k_start = (i<0?8:0);
        int gauss_index_k_inc = (i<0?-1:1);

        for (int j=-8; j<8; j+=5) {

            float *j_arr;
            if (j == -8 || j == 7) {
                j_arr = gauss_s1_c1;
            } else {
                j_arr = gauss_s1_c0;
            } 

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            int gauss_index_l = (j<0?8:0);
            int gauss_index_l_inc = (j<0?-1:1);
            for (int l = (j+8)*24; l < (j + 17)*24; l+=24, gauss_index_l+=gauss_index_l_inc) {
                float gauss_s1_y = j_arr[gauss_index_l];

                int gauss_index_k = gauss_index_k_start;
                for (int k = i+8; k < i + 17; ++k, gauss_index_k+=gauss_index_k_inc) {
                    
                    float gauss_s1_x = i_arr[gauss_index_k];

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = haarResponseX[l+k];
                    float ry = haarResponseY[l+k];
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            float gauss_s2 = gauss_s2_arr[gauss_s2_index];
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}